

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

void absl::lts_20250127::container_internal::
     Deallocate<8ul,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               (allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *alloc,void *p,
               size_t n)

{
  if (n != 0) {
    operator_delete(p,n + 7 & 0xfffffffffffffff8);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/container_memory.h"
                ,0x59,
                "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::basic_string_view<char>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  AT::deallocate(my_mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}